

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

void CheckName(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  char cVar1;
  TidyTagId TVar2;
  uint uVar3;
  Bool BVar4;
  ulong in_RAX;
  Node *pNVar5;
  ctmbstr s;
  tmbstr str;
  tchar c;
  undefined8 uStack_38;
  
  if ((attval == (AttVal *)0x0) || (str = attval->value, str == (tmbstr)0x0)) {
    prvTidyReportAttrError(doc,node,attval,0x256);
    return;
  }
  TVar2 = TidyTag_UNKNOWN;
  if ((node != (Node *)0x0) && (TVar2 = TidyTag_UNKNOWN, node->tag != (Dict *)0x0)) {
    TVar2 = node->tag->id;
  }
  if ((TVar2 - TidyTag_A < 0x40) &&
     ((0x800a003000000021U >> ((ulong)(TVar2 - TidyTag_A) & 0x3f) & 1) != 0)) {
    uStack_38 = in_RAX;
    if (*(int *)((doc->config).value + 100) != 0) {
      do {
        cVar1 = *str;
        if (cVar1 == '\0') goto LAB_001371c8;
        uStack_38 = (ulong)CONCAT14(cVar1,(undefined4)uStack_38);
        if (cVar1 < '\0') {
          uVar3 = prvTidyGetUTF8(str,(uint *)((long)&uStack_38 + 4));
          str = str + uVar3;
        }
        str = str + 1;
        BVar4 = prvTidyIsXMLNamechar(uStack_38._4_4_);
      } while (BVar4 != no);
      if (cVar1 != '\0') {
        prvTidyReportAttrError(doc,node,attval,0x22b);
      }
    }
LAB_001371c8:
    pNVar5 = GetNodeByAnchor(doc,attval->value);
    if (pNVar5 == node || pNVar5 == (Node *)0x0) {
      AddAnchor(doc,attval->value,node);
    }
    else {
      if (node->implicit == no) {
        uVar3 = 0x223;
      }
      else {
        uVar3 = 0x224;
      }
      prvTidyReportAttrError(doc,node,attval,uVar3);
    }
  }
  return;
}

Assistant:

void CheckName( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    Node *old;

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    if ( TY_(IsAnchorElement)(doc, node) )
    {
        if (cfgBool(doc, TidyXmlOut) && !IsValidNMTOKEN(attval->value))
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);

        if ((old = GetNodeByAnchor(doc, attval->value)) &&  old != node)
        {
            if (node->implicit) /* Is #709 - improve warning text */
                TY_(ReportAttrError)(doc, node, attval, ANCHOR_DUPLICATED);
            else
                TY_(ReportAttrError)( doc, node, attval, ANCHOR_NOT_UNIQUE);
        }
        else
            AddAnchor( doc, attval->value, node );
    }
}